

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_StringTemplateInclude::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  byte bVar5;
  TemplateString local_410;
  allocator local_3e9;
  string local_3e8 [8];
  string expected;
  TemplateString local_3c8;
  TemplateString local_3a8;
  TemplateString local_388;
  TemplateString local_368;
  undefined8 local_348;
  TemplateDictionary *sub_dict;
  TemplateDictionary local_320 [8];
  TemplateDictionary dict;
  TemplateString local_2b0;
  Template *local_290;
  Template *tpl;
  TemplateString local_268;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  allocator local_101;
  string local_100 [8];
  string text_indent;
  allocator local_d9;
  string local_d8 [8];
  string text_inc;
  allocator local_b1;
  string local_b0 [8];
  string text;
  allocator local_89;
  string local_88 [8];
  string cache_key_indent;
  allocator local_61;
  string local_60 [8];
  string cache_key_inc;
  allocator local_29;
  string local_28 [8];
  string cache_key;
  
  ctemplate::Template::ClearCache();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"TestStringTemplateInclude",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"TestStringTemplateInclude-inc",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"TestStringTemplateInclude-indent",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"<html>{{>INC}}</html>",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"<div>\n<p>\nUser {{USER}}\n</div>",&local_d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"<html>\n  {{>INC}}</html>",&local_101);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  ctemplate::TemplateString::TemplateString(&local_128,(string *)local_28);
  ctemplate::TemplateString::TemplateString(&local_148,(string *)local_b0);
  bVar5 = ctemplate::Template::StringToTemplateCache(&local_128,&local_148);
  if (((bVar5 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4b5,"Template::StringToTemplateCache(cache_key, text)");
    ctemplate::TemplateString::TemplateString(&local_168,(string *)local_28);
    ctemplate::TemplateString::TemplateString(&local_188,(string *)local_b0);
    bVar5 = ctemplate::Template::StringToTemplateCache(&local_168,&local_188);
    if ((bVar5 & 1) == 0) {
      __assert_fail("Template::StringToTemplateCache(cache_key, text)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4b5,"static void Test_Template_StringTemplateInclude::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_1a8,(string *)local_60);
  ctemplate::TemplateString::TemplateString(&local_1c8,(string *)local_d8);
  bVar5 = ctemplate::Template::StringToTemplateCache(&local_1a8,&local_1c8);
  if (((bVar5 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4b6,
           "Template::StringToTemplateCache(cache_key_inc, text_inc)");
    ctemplate::TemplateString::TemplateString(&local_1e8,(string *)local_60);
    ctemplate::TemplateString::TemplateString(&local_208,(string *)local_d8);
    bVar5 = ctemplate::Template::StringToTemplateCache(&local_1e8,&local_208);
    if ((bVar5 & 1) == 0) {
      __assert_fail("Template::StringToTemplateCache(cache_key_inc, text_inc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4b6,"static void Test_Template_StringTemplateInclude::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_228,(string *)local_88);
  ctemplate::TemplateString::TemplateString(&local_248,(string *)local_100);
  bVar5 = ctemplate::Template::StringToTemplateCache(&local_228,&local_248);
  if (((bVar5 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4b7,
           "Template::StringToTemplateCache(cache_key_indent, text_indent)");
    ctemplate::TemplateString::TemplateString(&local_268,(string *)local_88);
    ctemplate::TemplateString::TemplateString((TemplateString *)&tpl,(string *)local_100);
    bVar5 = ctemplate::Template::StringToTemplateCache(&local_268,(TemplateString *)&tpl);
    if ((bVar5 & 1) == 0) {
      __assert_fail("Template::StringToTemplateCache(cache_key_indent, text_indent)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x4b7,"static void Test_Template_StringTemplateInclude::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2b0,(string *)local_28);
  local_290 = (Template *)ctemplate::Template::GetTemplate(&local_2b0,DO_NOT_STRIP);
  if (local_290 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x4ba,"tpl");
    if (local_290 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x4ba,"static void Test_Template_StringTemplateInclude::Run()");
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&sub_dict,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_320,(TemplateString *)&sub_dict,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_368,"INC");
  TVar1.length_ = local_368.length_;
  TVar1.ptr_ = local_368.ptr_;
  TVar1.is_immutable_ = local_368.is_immutable_;
  TVar1._17_7_ = local_368._17_7_;
  TVar1.id_ = local_368.id_;
  local_348 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_388,(string *)local_60);
  TVar2.length_ = local_388.length_;
  TVar2.ptr_ = local_388.ptr_;
  TVar2.is_immutable_ = local_388.is_immutable_;
  TVar2._17_7_ = local_388._17_7_;
  TVar2.id_ = local_388.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar2);
  ctemplate::TemplateString::TemplateString(&local_3a8,"USER");
  ctemplate::TemplateString::TemplateString(&local_3c8,"John<>Doe");
  TVar3.length_ = local_3a8.length_;
  TVar3.ptr_ = local_3a8.ptr_;
  TVar3.is_immutable_ = local_3a8.is_immutable_;
  TVar3._17_7_ = local_3a8._17_7_;
  TVar3.id_ = local_3a8.id_;
  TVar4.length_ = local_3c8.length_;
  TVar4.ptr_ = local_3c8.ptr_;
  TVar4.is_immutable_ = local_3c8.is_immutable_;
  TVar4._17_7_ = local_3c8._17_7_;
  TVar4.id_ = local_3c8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar3,TVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3e8,"<html><div>\n<p>\nUser John<>Doe\n</div></html>",&local_3e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  ctemplate::AssertExpandIs(local_290,local_320,(string *)local_3e8,true);
  ctemplate::TemplateString::TemplateString(&local_410,(string *)local_88);
  local_290 = (Template *)ctemplate::Template::GetTemplate(&local_410,DO_NOT_STRIP);
  if (local_290 != (Template *)0x0) {
    std::__cxx11::string::operator=
              (local_3e8,"<html>\n  <div>\n  <p>\n  User John<>Doe\n  </div></html>");
    ctemplate::AssertExpandIs(local_290,local_320,(string *)local_3e8,true);
    ctemplate::Template::ClearCache();
    std::__cxx11::string::~string(local_3e8);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_320);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_28);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x4c7,"tpl");
  if (local_290 != (Template *)0x0) {
    exit(1);
  }
  __assert_fail("tpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0x4c7,"static void Test_Template_StringTemplateInclude::Run()");
}

Assistant:

TEST(Template, StringTemplateInclude) {
  Template::ClearCache();   // just for exercise.
  const string cache_key = "TestStringTemplateInclude";
  const string cache_key_inc = "TestStringTemplateInclude-inc";
  const string cache_key_indent = "TestStringTemplateInclude-indent";
  const string text = "<html>{{>INC}}</html>";
  const string text_inc = "<div>\n<p>\nUser {{USER}}\n</div>";
  const string text_indent = "<html>\n  {{>INC}}</html>";

  ASSERT(Template::StringToTemplateCache(cache_key, text));
  ASSERT(Template::StringToTemplateCache(cache_key_inc, text_inc));
  ASSERT(Template::StringToTemplateCache(cache_key_indent, text_indent));

  Template *tpl = Template::GetTemplate(cache_key, DO_NOT_STRIP);
  ASSERT(tpl);

  TemplateDictionary dict("dict");
  TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
  sub_dict->SetFilename(cache_key_inc);

  sub_dict->SetValue("USER", "John<>Doe");
  string expected = "<html><div>\n<p>\nUser John<>Doe\n</div></html>";
  AssertExpandIs(tpl, &dict, expected, true);

  // Repeat the same except that now the parent has a template-level
  // directive (by way of the automatic-line-indenter).
  tpl = Template::GetTemplate(cache_key_indent, DO_NOT_STRIP);
  ASSERT(tpl);
  expected =
      "<html>\n"
      "  <div>\n"
      "  <p>\n"
      "  User John<>Doe\n"
      "  </div>"
      "</html>";
  AssertExpandIs(tpl, &dict, expected, true);

  Template::ClearCache();
}